

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int flattenSubquery(Parse *pParse,Select *p,int iFrom,int isAgg)

{
  SrcList **ppSVar1;
  byte bVar2;
  u8 uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  sqlite3 *db;
  SrcList *pSVar7;
  char *pcVar8;
  ExprList *pEVar9;
  Table *pTVar10;
  SrcList *pSVar11;
  bool bVar12;
  Select *pSVar13;
  Select *pSVar14;
  Expr *pEVar15;
  Parse *pPVar16;
  long lVar17;
  anon_union_4_2_6146edf4_for_u *paVar18;
  long lVar19;
  undefined8 *puVar20;
  undefined8 *puVar21;
  int iVar22;
  Select *pSVar23;
  int iVar24;
  byte bVar25;
  SubstContext x;
  SrcList *local_90;
  SubstContext local_50;
  
  bVar25 = 0;
  db = pParse->db;
  if ((db->dbOptFlags & 1) != 0) {
    return 0;
  }
  if (p->pWin != (Window *)0x0) {
    return 0;
  }
  pSVar7 = p->pSrc;
  pSVar23 = pSVar7->a[iFrom].pSelect;
  if (pSVar23->pWin != (Window *)0x0) {
    return 0;
  }
  pcVar8 = pParse->zAuthContext;
  iVar4 = pSVar7->a[iFrom].iCursor;
  pEVar15 = pSVar23->pLimit;
  if (pEVar15 != (Expr *)0x0) {
    if (p->pLimit != (Expr *)0x0) {
      return 0;
    }
    if ((pEVar15 != (Expr *)0x0) && (pEVar15->pRight != (Expr *)0x0)) {
      return 0;
    }
  }
  uVar5 = p->selFlags;
  if ((pEVar15 != (Expr *)0x0 & (byte)(uVar5 >> 8) & 1) != 0) {
    return 0;
  }
  iVar24 = pSVar23->pSrc->nSrc;
  if (iVar24 == 0) {
    return 0;
  }
  uVar6 = pSVar23->selFlags;
  if ((uVar6 & 1) != 0) {
    return 0;
  }
  if (pEVar15 != (Expr *)0x0) {
    if (isAgg != 0) {
      return 0;
    }
    if (1 < pSVar7->nSrc) {
      return 0;
    }
  }
  pEVar9 = p->pOrderBy;
  if ((pEVar9 != (ExprList *)0x0) && (pSVar23->pOrderBy != (ExprList *)0x0)) {
    return 0;
  }
  if ((isAgg != 0) && (pSVar23->pOrderBy != (ExprList *)0x0)) {
    return 0;
  }
  if (pEVar15 == (Expr *)0x0) {
    if ((uVar6 >> 0xd & 1) != 0) {
      return 0;
    }
  }
  else {
    if (p->pWhere != (Expr *)0x0) {
      return 0;
    }
    if ((uVar5 & 1) != 0 && pEVar15 != (Expr *)0x0 || (uVar6 >> 0xd & 1) != 0) {
      return 0;
    }
  }
  bVar2 = pSVar7->a[iFrom].fg.jointype;
  iVar22 = 0;
  if ((bVar2 & 0x20) != 0) {
    if (isAgg != 0) {
      return 0;
    }
    if (1 < iVar24) {
      return 0;
    }
    if ((pSVar23->pSrc->a[0].pTab)->nModuleArg != 0) {
      return 0;
    }
    iVar22 = 1;
  }
  if (pSVar23->pPrior != (Select *)0x0) {
    if ((((uVar5 & 1) == 0 && isAgg == 0) && (pSVar23->pOrderBy == (ExprList *)0x0)) &&
       (pSVar14 = pSVar23, pSVar7->nSrc == 1)) {
      do {
        if (pSVar14 == (Select *)0x0) {
          if ((pEVar9 != (ExprList *)0x0) && (0 < (long)pEVar9->nExpr)) {
            lVar19 = 0;
            do {
              if (*(short *)((long)&pEVar9->a[0].u + lVar19) == 0) {
                return 0;
              }
              lVar19 = lVar19 + 0x20;
            } while ((long)pEVar9->nExpr * 0x20 != lVar19);
          }
          goto LAB_00177b1a;
        }
        if ((pSVar14->selFlags & 9) != 0) {
          return 0;
        }
        if (pSVar14->pPrior != (Select *)0x0) {
          return 0;
        }
        ppSVar1 = &pSVar14->pSrc;
        pSVar14 = (Select *)0x0;
      } while (0 < (*ppSVar1)->nSrc);
    }
    return 0;
  }
LAB_00177b1a:
  pParse->zAuthContext = pSVar7->a[iFrom].zName;
  sqlite3AuthCheck(pParse,0x15,(char *)0x0,(char *)0x0,(char *)0x0);
  pParse->zAuthContext = pcVar8;
  pSVar23 = pSVar23->pPrior;
  if (pSVar23 != (Select *)0x0) {
    do {
      pEVar15 = p->pLimit;
      pEVar9 = p->pOrderBy;
      pSVar14 = p->pPrior;
      p->pSrc = (SrcList *)0x0;
      p->pLimit = (Expr *)0x0;
      p->pOrderBy = (ExprList *)0x0;
      p->pPrior = (Select *)0x0;
      pSVar13 = sqlite3SelectDup(db,p,0);
      p->pLimit = pEVar15;
      p->pOrderBy = pEVar9;
      p->pSrc = pSVar7;
      p->op = 0x80;
      if (pSVar13 != (Select *)0x0) {
        pSVar13->pPrior = pSVar14;
        if (pSVar14 != (Select *)0x0) {
          pSVar14->pNext = pSVar13;
        }
        pSVar13->pNext = p;
        pSVar14 = pSVar13;
      }
      p->pPrior = pSVar14;
      if (db->mallocFailed != '\0') {
        return 1;
      }
      pSVar23 = pSVar23->pPrior;
    } while (pSVar23 != (Select *)0x0);
  }
  pcVar8 = pSVar7->a[iFrom].zDatabase;
  pSVar23 = pSVar7->a[iFrom].pSelect;
  if (pcVar8 != (char *)0x0) {
    sqlite3DbFreeNN(db,pcVar8);
  }
  pcVar8 = pSVar7->a[iFrom].zName;
  if (pcVar8 != (char *)0x0) {
    sqlite3DbFreeNN(db,pcVar8);
  }
  pcVar8 = pSVar7->a[iFrom].zAlias;
  if (pcVar8 != (char *)0x0) {
    sqlite3DbFreeNN(db,pcVar8);
  }
  pSVar7->a[iFrom].pSelect = (Select *)0x0;
  pSVar7->a[iFrom].zAlias = (char *)0x0;
  pSVar7->a[iFrom].zDatabase = (char *)0x0;
  pSVar7->a[iFrom].zName = (char *)0x0;
  pTVar10 = pSVar7->a[iFrom].pTab;
  if (pTVar10 != (Table *)0x0) {
    if (pTVar10->nTabRef == 1) {
      pPVar16 = pParse->pToplevel;
      if (pParse->pToplevel == (Parse *)0x0) {
        pPVar16 = pParse;
      }
      pTVar10->pNextZombie = pPVar16->pZombieTab;
      pPVar16->pZombieTab = pTVar10;
    }
    else {
      pTVar10->nTabRef = pTVar10->nTabRef - 1;
    }
    pSVar7->a[iFrom].pTab = (Table *)0x0;
  }
  if (p != (Select *)0x0) {
    iVar24 = -1;
    pSVar14 = pSVar23;
    do {
      pSVar11 = pSVar14->pSrc;
      uVar5 = pSVar11->nSrc;
      local_90 = p->pSrc;
      if (local_90 == (SrcList *)0x0) {
        local_90 = sqlite3SrcListAppend(pParse,(SrcList *)0x0,(Token *)0x0,(Token *)0x0);
        if (local_90 != (SrcList *)0x0) {
          p->pSrc = local_90;
          uVar3 = '\0';
          goto LAB_00177d3f;
        }
LAB_00177f09:
        bVar12 = false;
      }
      else {
        uVar3 = pSVar7->a[iFrom].fg.jointype;
LAB_00177d3f:
        if (1 < (int)uVar5) {
          local_90 = sqlite3SrcListEnlarge(pParse,local_90,uVar5 - 1,iFrom + 1);
          if (local_90 == (SrcList *)0x0) goto LAB_00177f09;
          p->pSrc = local_90;
        }
        if (0 < (int)uVar5) {
          lVar19 = 0;
          do {
            puVar21 = (undefined8 *)((long)&local_90->a[iFrom].pUsing + lVar19);
            sqlite3IdListDelete(db,(IdList *)*puVar21);
            puVar20 = (undefined8 *)((long)&pSVar11->a[0].pSchema + lVar19);
            puVar21 = puVar21 + -10;
            for (lVar17 = 0xe; lVar17 != 0; lVar17 = lVar17 + -1) {
              *puVar21 = *puVar20;
              puVar20 = puVar20 + (ulong)bVar25 * -2 + 1;
              puVar21 = puVar21 + (ulong)bVar25 * -2 + 1;
            }
            iVar24 = *(int *)((long)&pSVar11->a[0].iCursor + lVar19);
            puVar21 = (undefined8 *)((long)&pSVar11->a[0].pSchema + lVar19);
            *puVar21 = 0;
            puVar21[1] = 0;
            puVar21 = (undefined8 *)((long)&pSVar11->a[0].zName + lVar19);
            *puVar21 = 0;
            puVar21[1] = 0;
            puVar21 = (undefined8 *)((long)&pSVar11->a[0].pTab + lVar19);
            *puVar21 = 0;
            puVar21[1] = 0;
            puVar21 = (undefined8 *)((long)&pSVar11->a[0].addrFillSub + lVar19);
            *puVar21 = 0;
            puVar21[1] = 0;
            puVar21 = (undefined8 *)((long)&pSVar11->a[0].pUsing + lVar19);
            *puVar21 = 0;
            puVar21[1] = 0;
            puVar21 = (undefined8 *)((long)&pSVar11->a[0].u1 + lVar19);
            *puVar21 = 0;
            puVar21[1] = 0;
            puVar21 = (undefined8 *)((long)&pSVar11->a[0].iCursor + lVar19);
            *puVar21 = 0;
            puVar21[1] = 0;
            lVar19 = lVar19 + 0x70;
          } while ((ulong)uVar5 * 0x70 != lVar19);
        }
        local_90->a[iFrom].fg.jointype = uVar3;
        pEVar9 = pSVar14->pOrderBy;
        if (pEVar9 != (ExprList *)0x0) {
          if (0 < pEVar9->nExpr) {
            paVar18 = &pEVar9->a[0].u;
            lVar19 = 0;
            do {
              (paVar18->x).iOrderByCol = 0;
              lVar19 = lVar19 + 1;
              paVar18 = paVar18 + 8;
            } while (lVar19 < pEVar9->nExpr);
          }
          p->pOrderBy = pEVar9;
          pSVar14->pOrderBy = (ExprList *)0x0;
        }
        pEVar15 = pSVar14->pWhere;
        pSVar14->pWhere = (Expr *)0x0;
        if ((bVar2 & 0x20) != 0) {
          setJoinExpr(pEVar15,iVar24);
        }
        pEVar15 = sqlite3ExprAnd(db,pEVar15,p->pWhere);
        p->pWhere = pEVar15;
        if (db->mallocFailed == '\0') {
          local_50.pEList = pSVar14->pEList;
          local_50.pParse = pParse;
          local_50.iTable = iVar4;
          local_50.iNewTable = iVar24;
          local_50.isLeftJoin = iVar22;
          substSelect(&local_50,p,0);
        }
        p->selFlags = p->selFlags | pSVar14->selFlags & 1;
        bVar12 = true;
        if (pSVar14->pLimit != (Expr *)0x0) {
          p->pLimit = pSVar14->pLimit;
          pSVar14->pLimit = (Expr *)0x0;
        }
      }
      if (!bVar12) break;
      p = p->pPrior;
      pSVar14 = pSVar14->pPrior;
    } while (p != (Select *)0x0);
  }
  if (pSVar23 != (Select *)0x0) {
    clearSelect(db,pSVar23,1);
  }
  return 1;
}

Assistant:

static int flattenSubquery(
  Parse *pParse,       /* Parsing context */
  Select *p,           /* The parent or outer SELECT statement */
  int iFrom,           /* Index in p->pSrc->a[] of the inner subquery */
  int isAgg            /* True if outer SELECT uses aggregate functions */
){
  const char *zSavedAuthContext = pParse->zAuthContext;
  Select *pParent;    /* Current UNION ALL term of the other query */
  Select *pSub;       /* The inner query or "subquery" */
  Select *pSub1;      /* Pointer to the rightmost select in sub-query */
  SrcList *pSrc;      /* The FROM clause of the outer query */
  SrcList *pSubSrc;   /* The FROM clause of the subquery */
  int iParent;        /* VDBE cursor number of the pSub result set temp table */
  int iNewParent = -1;/* Replacement table for iParent */
  int isLeftJoin = 0; /* True if pSub is the right side of a LEFT JOIN */    
  int i;              /* Loop counter */
  Expr *pWhere;                    /* The WHERE clause */
  struct SrcList_item *pSubitem;   /* The subquery */
  sqlite3 *db = pParse->db;

  /* Check to see if flattening is permitted.  Return 0 if not.
  */
  assert( p!=0 );
  assert( p->pPrior==0 );
  if( OptimizationDisabled(db, SQLITE_QueryFlattener) ) return 0;
  pSrc = p->pSrc;
  assert( pSrc && iFrom>=0 && iFrom<pSrc->nSrc );
  pSubitem = &pSrc->a[iFrom];
  iParent = pSubitem->iCursor;
  pSub = pSubitem->pSelect;
  assert( pSub!=0 );

#ifndef SQLITE_OMIT_WINDOWFUNC
  if( p->pWin || pSub->pWin ) return 0;                  /* Restriction (25) */
#endif

  pSubSrc = pSub->pSrc;
  assert( pSubSrc );
  /* Prior to version 3.1.2, when LIMIT and OFFSET had to be simple constants,
  ** not arbitrary expressions, we allowed some combining of LIMIT and OFFSET
  ** because they could be computed at compile-time.  But when LIMIT and OFFSET
  ** became arbitrary expressions, we were forced to add restrictions (13)
  ** and (14). */
  if( pSub->pLimit && p->pLimit ) return 0;              /* Restriction (13) */
  if( pSub->pLimit && pSub->pLimit->pRight ) return 0;   /* Restriction (14) */
  if( (p->selFlags & SF_Compound)!=0 && pSub->pLimit ){
    return 0;                                            /* Restriction (15) */
  }
  if( pSubSrc->nSrc==0 ) return 0;                       /* Restriction (7)  */
  if( pSub->selFlags & SF_Distinct ) return 0;           /* Restriction (4)  */
  if( pSub->pLimit && (pSrc->nSrc>1 || isAgg) ){
     return 0;         /* Restrictions (8)(9) */
  }
  if( p->pOrderBy && pSub->pOrderBy ){
     return 0;                                           /* Restriction (11) */
  }
  if( isAgg && pSub->pOrderBy ) return 0;                /* Restriction (16) */
  if( pSub->pLimit && p->pWhere ) return 0;              /* Restriction (19) */
  if( pSub->pLimit && (p->selFlags & SF_Distinct)!=0 ){
     return 0;         /* Restriction (21) */
  }
  if( pSub->selFlags & (SF_Recursive) ){
    return 0; /* Restrictions (22) */
  }

  /*
  ** If the subquery is the right operand of a LEFT JOIN, then the
  ** subquery may not be a join itself (3a). Example of why this is not
  ** allowed:
  **
  **         t1 LEFT OUTER JOIN (t2 JOIN t3)
  **
  ** If we flatten the above, we would get
  **
  **         (t1 LEFT OUTER JOIN t2) JOIN t3
  **
  ** which is not at all the same thing.
  **
  ** If the subquery is the right operand of a LEFT JOIN, then the outer
  ** query cannot be an aggregate. (3c)  This is an artifact of the way
  ** aggregates are processed - there is no mechanism to determine if
  ** the LEFT JOIN table should be all-NULL.
  **
  ** See also tickets #306, #350, and #3300.
  */
  if( (pSubitem->fg.jointype & JT_OUTER)!=0 ){
    isLeftJoin = 1;
    if( pSubSrc->nSrc>1 || isAgg || IsVirtual(pSubSrc->a[0].pTab) ){
      /*  (3a)             (3c)     (3b) */
      return 0;
    }
  }
#ifdef SQLITE_EXTRA_IFNULLROW
  else if( iFrom>0 && !isAgg ){
    /* Setting isLeftJoin to -1 causes OP_IfNullRow opcodes to be generated for
    ** every reference to any result column from subquery in a join, even
    ** though they are not necessary.  This will stress-test the OP_IfNullRow 
    ** opcode. */
    isLeftJoin = -1;
  }
#endif

  /* Restriction (17): If the sub-query is a compound SELECT, then it must
  ** use only the UNION ALL operator. And none of the simple select queries
  ** that make up the compound SELECT are allowed to be aggregate or distinct
  ** queries.
  */
  if( pSub->pPrior ){
    if( pSub->pOrderBy ){
      return 0;  /* Restriction (20) */
    }
    if( isAgg || (p->selFlags & SF_Distinct)!=0 || pSrc->nSrc!=1 ){
      return 0; /* (17d1), (17d2), or (17d3) */
    }
    for(pSub1=pSub; pSub1; pSub1=pSub1->pPrior){
      testcase( (pSub1->selFlags & (SF_Distinct|SF_Aggregate))==SF_Distinct );
      testcase( (pSub1->selFlags & (SF_Distinct|SF_Aggregate))==SF_Aggregate );
      assert( pSub->pSrc!=0 );
      assert( pSub->pEList->nExpr==pSub1->pEList->nExpr );
      if( (pSub1->selFlags & (SF_Distinct|SF_Aggregate))!=0    /* (17b) */
       || (pSub1->pPrior && pSub1->op!=TK_ALL)                 /* (17a) */
       || pSub1->pSrc->nSrc<1                                  /* (17c) */
      ){
        return 0;
      }
      testcase( pSub1->pSrc->nSrc>1 );
    }

    /* Restriction (18). */
    if( p->pOrderBy ){
      int ii;
      for(ii=0; ii<p->pOrderBy->nExpr; ii++){
        if( p->pOrderBy->a[ii].u.x.iOrderByCol==0 ) return 0;
      }
    }
  }

  /* Ex-restriction (23):
  ** The only way that the recursive part of a CTE can contain a compound
  ** subquery is for the subquery to be one term of a join.  But if the
  ** subquery is a join, then the flattening has already been stopped by
  ** restriction (17d3)
  */
  assert( (p->selFlags & SF_Recursive)==0 || pSub->pPrior==0 );

  /***** If we reach this point, flattening is permitted. *****/
  SELECTTRACE(1,pParse,p,("flatten %u.%p from term %d\n",
                   pSub->selId, pSub, iFrom));

  /* Authorize the subquery */
  pParse->zAuthContext = pSubitem->zName;
  TESTONLY(i =) sqlite3AuthCheck(pParse, SQLITE_SELECT, 0, 0, 0);
  testcase( i==SQLITE_DENY );
  pParse->zAuthContext = zSavedAuthContext;

  /* If the sub-query is a compound SELECT statement, then (by restrictions
  ** 17 and 18 above) it must be a UNION ALL and the parent query must 
  ** be of the form:
  **
  **     SELECT <expr-list> FROM (<sub-query>) <where-clause> 
  **
  ** followed by any ORDER BY, LIMIT and/or OFFSET clauses. This block
  ** creates N-1 copies of the parent query without any ORDER BY, LIMIT or 
  ** OFFSET clauses and joins them to the left-hand-side of the original
  ** using UNION ALL operators. In this case N is the number of simple
  ** select statements in the compound sub-query.
  **
  ** Example:
  **
  **     SELECT a+1 FROM (
  **        SELECT x FROM tab
  **        UNION ALL
  **        SELECT y FROM tab
  **        UNION ALL
  **        SELECT abs(z*2) FROM tab2
  **     ) WHERE a!=5 ORDER BY 1
  **
  ** Transformed into:
  **
  **     SELECT x+1 FROM tab WHERE x+1!=5
  **     UNION ALL
  **     SELECT y+1 FROM tab WHERE y+1!=5
  **     UNION ALL
  **     SELECT abs(z*2)+1 FROM tab2 WHERE abs(z*2)+1!=5
  **     ORDER BY 1
  **
  ** We call this the "compound-subquery flattening".
  */
  for(pSub=pSub->pPrior; pSub; pSub=pSub->pPrior){
    Select *pNew;
    ExprList *pOrderBy = p->pOrderBy;
    Expr *pLimit = p->pLimit;
    Select *pPrior = p->pPrior;
    p->pOrderBy = 0;
    p->pSrc = 0;
    p->pPrior = 0;
    p->pLimit = 0;
    pNew = sqlite3SelectDup(db, p, 0);
    p->pLimit = pLimit;
    p->pOrderBy = pOrderBy;
    p->pSrc = pSrc;
    p->op = TK_ALL;
    if( pNew==0 ){
      p->pPrior = pPrior;
    }else{
      pNew->pPrior = pPrior;
      if( pPrior ) pPrior->pNext = pNew;
      pNew->pNext = p;
      p->pPrior = pNew;
      SELECTTRACE(2,pParse,p,("compound-subquery flattener"
                              " creates %u as peer\n",pNew->selId));
    }
    if( db->mallocFailed ) return 1;
  }

  /* Begin flattening the iFrom-th entry of the FROM clause 
  ** in the outer query.
  */
  pSub = pSub1 = pSubitem->pSelect;

  /* Delete the transient table structure associated with the
  ** subquery
  */
  sqlite3DbFree(db, pSubitem->zDatabase);
  sqlite3DbFree(db, pSubitem->zName);
  sqlite3DbFree(db, pSubitem->zAlias);
  pSubitem->zDatabase = 0;
  pSubitem->zName = 0;
  pSubitem->zAlias = 0;
  pSubitem->pSelect = 0;

  /* Defer deleting the Table object associated with the
  ** subquery until code generation is
  ** complete, since there may still exist Expr.pTab entries that
  ** refer to the subquery even after flattening.  Ticket #3346.
  **
  ** pSubitem->pTab is always non-NULL by test restrictions and tests above.
  */
  if( ALWAYS(pSubitem->pTab!=0) ){
    Table *pTabToDel = pSubitem->pTab;
    if( pTabToDel->nTabRef==1 ){
      Parse *pToplevel = sqlite3ParseToplevel(pParse);
      pTabToDel->pNextZombie = pToplevel->pZombieTab;
      pToplevel->pZombieTab = pTabToDel;
    }else{
      pTabToDel->nTabRef--;
    }
    pSubitem->pTab = 0;
  }

  /* The following loop runs once for each term in a compound-subquery
  ** flattening (as described above).  If we are doing a different kind
  ** of flattening - a flattening other than a compound-subquery flattening -
  ** then this loop only runs once.
  **
  ** This loop moves all of the FROM elements of the subquery into the
  ** the FROM clause of the outer query.  Before doing this, remember
  ** the cursor number for the original outer query FROM element in
  ** iParent.  The iParent cursor will never be used.  Subsequent code
  ** will scan expressions looking for iParent references and replace
  ** those references with expressions that resolve to the subquery FROM
  ** elements we are now copying in.
  */
  for(pParent=p; pParent; pParent=pParent->pPrior, pSub=pSub->pPrior){
    int nSubSrc;
    u8 jointype = 0;
    pSubSrc = pSub->pSrc;     /* FROM clause of subquery */
    nSubSrc = pSubSrc->nSrc;  /* Number of terms in subquery FROM clause */
    pSrc = pParent->pSrc;     /* FROM clause of the outer query */

    if( pSrc ){
      assert( pParent==p );  /* First time through the loop */
      jointype = pSubitem->fg.jointype;
    }else{
      assert( pParent!=p );  /* 2nd and subsequent times through the loop */
      pSrc = sqlite3SrcListAppend(pParse, 0, 0, 0);
      if( pSrc==0 ) break;
      pParent->pSrc = pSrc;
    }

    /* The subquery uses a single slot of the FROM clause of the outer
    ** query.  If the subquery has more than one element in its FROM clause,
    ** then expand the outer query to make space for it to hold all elements
    ** of the subquery.
    **
    ** Example:
    **
    **    SELECT * FROM tabA, (SELECT * FROM sub1, sub2), tabB;
    **
    ** The outer query has 3 slots in its FROM clause.  One slot of the
    ** outer query (the middle slot) is used by the subquery.  The next
    ** block of code will expand the outer query FROM clause to 4 slots.
    ** The middle slot is expanded to two slots in order to make space
    ** for the two elements in the FROM clause of the subquery.
    */
    if( nSubSrc>1 ){
      pSrc = sqlite3SrcListEnlarge(pParse, pSrc, nSubSrc-1,iFrom+1);
      if( pSrc==0 ) break;
      pParent->pSrc = pSrc;
    }

    /* Transfer the FROM clause terms from the subquery into the
    ** outer query.
    */
    for(i=0; i<nSubSrc; i++){
      sqlite3IdListDelete(db, pSrc->a[i+iFrom].pUsing);
      assert( pSrc->a[i+iFrom].fg.isTabFunc==0 );
      pSrc->a[i+iFrom] = pSubSrc->a[i];
      iNewParent = pSubSrc->a[i].iCursor;
      memset(&pSubSrc->a[i], 0, sizeof(pSubSrc->a[i]));
    }
    pSrc->a[iFrom].fg.jointype = jointype;
  
    /* Now begin substituting subquery result set expressions for 
    ** references to the iParent in the outer query.
    ** 
    ** Example:
    **
    **   SELECT a+5, b*10 FROM (SELECT x*3 AS a, y+10 AS b FROM t1) WHERE a>b;
    **   \                     \_____________ subquery __________/          /
    **    \_____________________ outer query ______________________________/
    **
    ** We look at every expression in the outer query and every place we see
    ** "a" we substitute "x*3" and every place we see "b" we substitute "y+10".
    */
    if( pSub->pOrderBy ){
      /* At this point, any non-zero iOrderByCol values indicate that the
      ** ORDER BY column expression is identical to the iOrderByCol'th
      ** expression returned by SELECT statement pSub. Since these values
      ** do not necessarily correspond to columns in SELECT statement pParent,
      ** zero them before transfering the ORDER BY clause.
      **
      ** Not doing this may cause an error if a subsequent call to this
      ** function attempts to flatten a compound sub-query into pParent
      ** (the only way this can happen is if the compound sub-query is
      ** currently part of pSub->pSrc). See ticket [d11a6e908f].  */
      ExprList *pOrderBy = pSub->pOrderBy;
      for(i=0; i<pOrderBy->nExpr; i++){
        pOrderBy->a[i].u.x.iOrderByCol = 0;
      }
      assert( pParent->pOrderBy==0 );
      pParent->pOrderBy = pOrderBy;
      pSub->pOrderBy = 0;
    }
    pWhere = pSub->pWhere;
    pSub->pWhere = 0;
    if( isLeftJoin>0 ){
      setJoinExpr(pWhere, iNewParent);
    }
    pParent->pWhere = sqlite3ExprAnd(db, pWhere, pParent->pWhere);
    if( db->mallocFailed==0 ){
      SubstContext x;
      x.pParse = pParse;
      x.iTable = iParent;
      x.iNewTable = iNewParent;
      x.isLeftJoin = isLeftJoin;
      x.pEList = pSub->pEList;
      substSelect(&x, pParent, 0);
    }
  
    /* The flattened query is distinct if either the inner or the
    ** outer query is distinct. 
    */
    pParent->selFlags |= pSub->selFlags & SF_Distinct;
  
    /*
    ** SELECT ... FROM (SELECT ... LIMIT a OFFSET b) LIMIT x OFFSET y;
    **
    ** One is tempted to try to add a and b to combine the limits.  But this
    ** does not work if either limit is negative.
    */
    if( pSub->pLimit ){
      pParent->pLimit = pSub->pLimit;
      pSub->pLimit = 0;
    }
  }

  /* Finially, delete what is left of the subquery and return
  ** success.
  */
  sqlite3SelectDelete(db, pSub1);

#if SELECTTRACE_ENABLED
  if( sqlite3SelectTrace & 0x100 ){
    SELECTTRACE(0x100,pParse,p,("After flattening:\n"));
    sqlite3TreeViewSelect(0, p, 0);
  }
#endif

  return 1;
}